

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O3

bool __thiscall OneKey::check(OneKey *this,AActor *owner)

{
  AInventory *pAVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *pAVar5;
  PClassActor *pPVar6;
  bool bVar7;
  int local_30;
  int local_2c;
  PClassActor *pPVar4;
  undefined4 extraout_var_01;
  
  pPVar2 = AKey::RegistrationInfo.MyClass;
  pPVar4 = (PClassActor *)(owner->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClassActor *)0x0) {
    iVar3 = (**(owner->super_DThinker).super_DObject._vptr_DObject)(owner);
    pPVar4 = (PClassActor *)CONCAT44(extraout_var,iVar3);
    (owner->super_DThinker).super_DObject.Class = (PClass *)pPVar4;
  }
  bVar7 = pPVar4 != (PClassActor *)0x0;
  pPVar6 = pPVar4;
  if (pPVar4 != (PClassActor *)pPVar2 && bVar7) {
    do {
      pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
      bVar7 = pPVar6 != (PClassActor *)0x0;
      if (pPVar6 == (PClassActor *)pPVar2) break;
    } while (pPVar6 != (PClassActor *)0x0);
  }
  if (bVar7) {
    pPVar6 = this->key;
    if (pPVar4 == (PClassActor *)0x0) {
      iVar3 = (**(owner->super_DThinker).super_DObject._vptr_DObject)(owner);
      pPVar4 = (PClassActor *)CONCAT44(extraout_var_00,iVar3);
      (owner->super_DThinker).super_DObject.Class = (PClass *)pPVar4;
    }
    if (pPVar4 == pPVar6) {
      bVar7 = true;
    }
    else {
      (*(owner->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_2c,owner);
      bVar7 = local_2c == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    }
  }
  else {
    pAVar1 = (owner->Inventory).field_0.p;
    if (pAVar1 != (AInventory *)0x0) {
      if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        do {
          pAVar5 = pAVar1;
          pPVar4 = this->key;
          pPVar6 = (PClassActor *)(pAVar5->super_AActor).super_DThinker.super_DObject.Class;
          if (pPVar6 == (PClassActor *)0x0) {
            iVar3 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
            pPVar6 = (PClassActor *)CONCAT44(extraout_var_01,iVar3);
            (pAVar5->super_AActor).super_DThinker.super_DObject.Class = (PClass *)pPVar6;
          }
          if (pPVar6 == pPVar4) {
            return true;
          }
          (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x21])
                    (&local_30,pAVar5);
          if (local_30 == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index) {
            return true;
          }
          pAVar1 = (pAVar5->super_AActor).Inventory.field_0.p;
          if (pAVar1 == (AInventory *)0x0) goto LAB_0060c7e4;
        } while (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        (pAVar5->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      }
      else {
        (owner->Inventory).field_0.p = (AInventory *)0x0;
      }
    }
LAB_0060c7e4:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool check(AActor *owner)
	{
		if (owner->IsKindOf(RUNTIME_CLASS(AKey)))
		{
			// P_GetMapColorForKey() checks the key directly
			return owner->IsA(key) || owner->GetSpecies() == key->TypeName;
		}
		else 
		{
			// Other calls check an actor that may have a key in its inventory.
			AInventory *item;

			for (item = owner->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsA(key))
				{
					return true;
				}
				else if (item->GetSpecies() == key->TypeName)
				{
					return true;
				}
			}
			return false;
		}
	}